

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnAtomicRmw
          (SharedValidator *this,Location *loc,Opcode opcode,Var *memidx,Address alignment)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  MemoryType mt;
  Opcode local_e4;
  Address local_e0;
  Limits local_d8;
  Var local_c0;
  Info local_78;
  
  local_e4.enum_ = opcode.enum_;
  local_e0 = alignment;
  RVar1 = CheckInstr(this,opcode,loc);
  local_d8.initial = 0;
  local_d8.max._0_7_ = 0;
  local_d8._15_4_ = 0;
  Var::Var(&local_c0,memidx);
  RVar2 = CheckMemoryIndex(this,&local_c0,(MemoryType *)&local_d8);
  Var::~Var(&local_c0);
  Opcode::GetInfo(&local_78,&local_e4);
  RVar3 = CheckAtomicAlign(this,loc,local_e0,local_78.memory_size);
  RVar4 = TypeChecker::OnAtomicRmw(&this->typechecker_,local_e4,&local_d8);
  RVar1.enum_._0_1_ =
       RVar4.enum_ == Error ||
       (RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error));
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnAtomicRmw(const Location& loc,
                                    Opcode opcode,
                                    Var memidx,
                                    Address alignment) {
  Result result = CheckInstr(opcode, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= CheckAtomicAlign(loc, alignment, opcode.GetMemorySize());
  result |= typechecker_.OnAtomicRmw(opcode, mt.limits);
  return result;
}